

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitTableInit(PrintExpressionContents *this,TableInit *curr)

{
  ostream *o;
  string_view local_28;
  TableInit *local_18;
  TableInit *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (TableInit *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"table.init ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->table,this->o);
  std::operator<<(this->o,' ');
  wasm::Name::print(&local_18->segment,this->o);
  return;
}

Assistant:

void visitTableInit(TableInit* curr) {
    printMedium(o, "table.init ");
    curr->table.print(o);
    o << ' ';
    curr->segment.print(o);
  }